

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::DoRightParen(ParseState *this)

{
  Regexp *this_00;
  bool bVar1;
  RegexpOp RVar2;
  ParseFlags PVar3;
  Regexp *pRVar4;
  Regexp **ppRVar5;
  Regexp *local_30;
  Regexp *re;
  Regexp *r2;
  Regexp *r1;
  ParseState *this_local;
  
  DoAlternation(this);
  local_30 = this->stacktop_;
  if (((local_30 != (Regexp *)0x0) && (this_00 = local_30->down_, this_00 != (Regexp *)0x0)) &&
     (RVar2 = Regexp::op(this_00), RVar2 == (kRegexpCharClass|kRegexpEmptyMatch))) {
    this->stacktop_ = this_00->down_;
    PVar3 = parse_flags(this_00);
    this->flags_ = PVar3;
    if ((this_00->field_7).field_0.max_ < 1) {
      Decref(this_00);
    }
    else {
      this_00->op_ = '\v';
      AllocSub(this_00,1);
      pRVar4 = FinishRegexp(this,local_30);
      ppRVar5 = Regexp::sub(this_00);
      *ppRVar5 = pRVar4;
      bVar1 = ComputeSimple(this_00);
      this_00->simple_ = bVar1;
      local_30 = this_00;
    }
    bVar1 = PushRegexp(this,local_30);
    return bVar1;
  }
  RegexpStatus::set_code(this->status_,kRegexpUnexpectedParen);
  RegexpStatus::set_error_arg(this->status_,&this->whole_regexp_);
  return false;
}

Assistant:

bool Regexp::ParseState::DoRightParen() {
  // Finish the current concatenation and alternation.
  DoAlternation();

  // The stack should be: LeftParen regexp
  // Remove the LeftParen, leaving the regexp,
  // parenthesized.
  Regexp* r1;
  Regexp* r2;
  if ((r1 = stacktop_) == NULL ||
      (r2 = r1->down_) == NULL ||
      r2->op() != kLeftParen) {
    status_->set_code(kRegexpUnexpectedParen);
    status_->set_error_arg(whole_regexp_);
    return false;
  }

  // Pop off r1, r2.  Will Decref or reuse below.
  stacktop_ = r2->down_;

  // Restore flags from when paren opened.
  Regexp* re = r2;
  flags_ = re->parse_flags();

  // Rewrite LeftParen as capture if needed.
  if (re->cap_ > 0) {
    re->op_ = kRegexpCapture;
    // re->cap_ is already set
    re->AllocSub(1);
    re->sub()[0] = FinishRegexp(r1);
    re->simple_ = re->ComputeSimple();
  } else {
    re->Decref();
    re = r1;
  }
  return PushRegexp(re);
}